

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O1

void __thiscall duckdb::Transformer::Transformer(Transformer *this,ParserOptions *options)

{
  (this->parent).ptr = (Transformer *)0x0;
  this->options = options;
  this->prepared_statement_parameter_index = 0;
  (this->named_param_map)._M_h._M_buckets = &(this->named_param_map)._M_h._M_single_bucket;
  (this->named_param_map)._M_h._M_bucket_count = 1;
  (this->named_param_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->named_param_map)._M_h._M_element_count = 0;
  (this->named_param_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->named_param_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->named_param_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->last_param_type = INVALID;
  (this->window_clauses)._M_h._M_buckets = &(this->window_clauses)._M_h._M_single_bucket;
  (this->window_clauses)._M_h._M_bucket_count = 1;
  (this->window_clauses)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->window_clauses)._M_h._M_element_count = 0;
  (this->window_clauses)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->window_clauses)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->window_clauses)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->pivot_entries).
  super_vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pivot_entries).
  super_vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pivot_entries).
  super_vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->stored_cte_map).
  super_vector<duckdb::CommonTableExpressionMap_*,_std::allocator<duckdb::CommonTableExpressionMap_*>_>
  .
  super__Vector_base<duckdb::CommonTableExpressionMap_*,_std::allocator<duckdb::CommonTableExpressionMap_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stored_cte_map).
  super_vector<duckdb::CommonTableExpressionMap_*,_std::allocator<duckdb::CommonTableExpressionMap_*>_>
  .
  super__Vector_base<duckdb::CommonTableExpressionMap_*,_std::allocator<duckdb::CommonTableExpressionMap_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stored_cte_map).
  super_vector<duckdb::CommonTableExpressionMap_*,_std::allocator<duckdb::CommonTableExpressionMap_*>_>
  .
  super__Vector_base<duckdb::CommonTableExpressionMap_*,_std::allocator<duckdb::CommonTableExpressionMap_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->in_window_definition = false;
  this->stack_depth = 0xffffffffffffffff;
  return;
}

Assistant:

Transformer::Transformer(ParserOptions &options)
    : parent(nullptr), options(options), stack_depth(DConstants::INVALID_INDEX) {
}